

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O2

void __thiscall
duckdb::WindowLocalSourceState::GetData(WindowLocalSourceState *this,DataChunk *result)

{
  unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
  *this_00;
  DataChunk *this_01;
  DataChunk *this_02;
  idx_t iVar1;
  WindowGlobalSinkState *pWVar2;
  tuple<duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  __p;
  pointer pRVar3;
  WindowHashGroup *pWVar4;
  WindowSourceTask *pWVar5;
  WindowHashGroup *pWVar6;
  reference this_03;
  const_reference this_04;
  type this_05;
  reference this_06;
  type gstate;
  reference this_07;
  type lstate;
  reference pvVar7;
  reference pvVar8;
  idx_t expr_idx;
  ulong uVar9;
  idx_t col_idx;
  ulong __n;
  DataChunk *this_08;
  _Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false> local_38;
  
  this_00 = &this->scanner;
  if ((this->scanner).
      super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
      .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl !=
      (RowDataCollectionScanner *)0x0) {
    pRVar3 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
             ::operator->(this_00);
    if (pRVar3->total_count != pRVar3->total_scanned) goto LAB_0198fecb;
  }
  pWVar4 = optional_ptr<duckdb::WindowHashGroup,_true>::operator->(&this->window_hash_group);
  optional_ptr<duckdb::WindowSourceTask,_true>::operator->(&this->task);
  WindowHashGroup::GetEvaluateScanner((WindowHashGroup *)&stack0xffffffffffffffc8,(idx_t)pWVar4);
  __p.
  super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
        )(_Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
          )local_38._M_head_impl;
  local_38._M_head_impl = (PartitionGlobalHashGroup *)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
  ::reset((__uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
           *)this_00,
          (pointer)__p.
                   super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
                   .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl);
  ::std::
  unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
  ::~unique_ptr((unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                 *)&stack0xffffffffffffffc8);
  pWVar4 = optional_ptr<duckdb::WindowHashGroup,_true>::operator->(&this->window_hash_group);
  iVar1 = pWVar4->batch_base;
  pWVar5 = optional_ptr<duckdb::WindowSourceTask,_true>::operator->(&this->task);
  this->batch_index = iVar1 + pWVar5->begin_idx;
LAB_0198fecb:
  pRVar3 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
           ::operator->(this_00);
  iVar1 = pRVar3->total_scanned;
  this_01 = &this->input_chunk;
  DataChunk::Reset(this_01);
  pRVar3 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
           ::operator->(this_00);
  RowDataCollectionScanner::Scan(pRVar3,this_01);
  pWVar2 = this->gsource->gsink;
  pWVar4 = optional_ptr<duckdb::WindowHashGroup,_true>::operator->(&this->window_hash_group);
  pWVar6 = optional_ptr<duckdb::WindowHashGroup,_true>::operator->(&this->window_hash_group);
  pWVar5 = optional_ptr<duckdb::WindowSourceTask,_true>::operator->(&this->task);
  this_03 = ::std::
            vector<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
            ::at(&(pWVar6->thread_states).
                  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
                 ,pWVar5->thread_idx);
  this_02 = &this->output_chunk;
  DataChunk::Reset(this_02);
  this_08 = &this->eval_chunk;
  for (uVar9 = 0;
      uVar9 < (ulong)((long)(pWVar2->executors).
                            super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pWVar2->executors).
                            super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1) {
    this_04 = vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_true>
              ::get<true>(&pWVar2->executors,uVar9);
    this_05 = unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>
              ::operator*(this_04);
    this_06 = vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_true>
              ::get<true>(&pWVar4->gestates,uVar9);
    gstate = unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>
             ::operator*(this_06);
    this_07 = vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>
              ::get<true>(this_03,uVar9);
    lstate = unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>
             ::operator*(this_07);
    pvVar7 = vector<duckdb::Vector,_true>::get<true>(&this_02->data,uVar9);
    if ((this->eval_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->eval_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (this->eval_chunk).count = (this->input_chunk).count;
    }
    else {
      DataChunk::Reset(this_08);
      ExpressionExecutor::Execute(&this->eval_exec,this_01,this_08);
    }
    WindowExecutor::Evaluate(this_05,iVar1,this_08,pvVar7,lstate,gstate);
  }
  (this->output_chunk).count = (this->input_chunk).count;
  DataChunk::Verify(this_02);
  result->count = (this->input_chunk).count;
  for (uVar9 = 0;
      uVar9 < (ulong)(((long)(this->input_chunk).data.
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->input_chunk).data.
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x68); uVar9 = uVar9 + 1) {
    pvVar7 = vector<duckdb::Vector,_true>::get<true>(&result->data,uVar9);
    pvVar8 = vector<duckdb::Vector,_true>::get<true>(&this_01->data,uVar9);
    Vector::Reference(pvVar7,pvVar8);
  }
  for (__n = 0; __n < (ulong)(((long)(this->output_chunk).data.
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->output_chunk).data.
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x68);
      __n = __n + 1) {
    pvVar7 = vector<duckdb::Vector,_true>::get<true>(&result->data,uVar9 + __n);
    pvVar8 = vector<duckdb::Vector,_true>::get<true>(&this_02->data,__n);
    Vector::Reference(pvVar7,pvVar8);
  }
  pRVar3 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
           ::operator->(this_00);
  if (pRVar3->total_count == pRVar3->total_scanned) {
    pWVar5 = optional_ptr<duckdb::WindowSourceTask,_true>::operator->(&this->task);
    pWVar5->begin_idx = pWVar5->begin_idx + 1;
  }
  DataChunk::Verify(result);
  return;
}

Assistant:

void WindowLocalSourceState::GetData(DataChunk &result) {
	D_ASSERT(window_hash_group->GetStage() == WindowGroupStage::GETDATA);

	if (!scanner || !scanner->Remaining()) {
		scanner = window_hash_group->GetEvaluateScanner(task->begin_idx);
		batch_index = window_hash_group->batch_base + task->begin_idx;
	}

	const auto position = scanner->Scanned();
	input_chunk.Reset();
	scanner->Scan(input_chunk);

	const auto &executors = gsource.gsink.executors;
	auto &gestates = window_hash_group->gestates;
	auto &local_states = window_hash_group->thread_states.at(task->thread_idx);
	output_chunk.Reset();
	for (idx_t expr_idx = 0; expr_idx < executors.size(); ++expr_idx) {
		auto &executor = *executors[expr_idx];
		auto &gstate = *gestates[expr_idx];
		auto &lstate = *local_states[expr_idx];
		auto &result = output_chunk.data[expr_idx];
		if (eval_chunk.data.empty()) {
			eval_chunk.SetCardinality(input_chunk);
		} else {
			eval_chunk.Reset();
			eval_exec.Execute(input_chunk, eval_chunk);
		}
		executor.Evaluate(position, eval_chunk, result, lstate, gstate);
	}
	output_chunk.SetCardinality(input_chunk);
	output_chunk.Verify();

	idx_t out_idx = 0;
	result.SetCardinality(input_chunk);
	for (idx_t col_idx = 0; col_idx < input_chunk.ColumnCount(); col_idx++) {
		result.data[out_idx++].Reference(input_chunk.data[col_idx]);
	}
	for (idx_t col_idx = 0; col_idx < output_chunk.ColumnCount(); col_idx++) {
		result.data[out_idx++].Reference(output_chunk.data[col_idx]);
	}

	// If we done with this block, move to the next one
	if (!scanner->Remaining()) {
		++task->begin_idx;
	}

	result.Verify();
}